

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall cmDocumentation::addCPackStandardDocSections(cmDocumentation *this)

{
  cmDocumentationSection *this_00;
  mapped_type *ppcVar1;
  allocator local_31;
  key_type local_30;
  
  this_00 = (cmDocumentationSection *)operator_new(0x38);
  cmDocumentationSection::cmDocumentationSection(this_00,"Generators","GENERATORS");
  cmDocumentationSection::Append(this_00,cmDocumentationGeneratorsHeader);
  std::__cxx11::string::string((string *)&local_30,"Generators",&local_31);
  ppcVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
            ::operator[](&this->AllSections,&local_30);
  *ppcVar1 = this_00;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmDocumentation::addCPackStandardDocSections()
{
    cmDocumentationSection *sec;

    sec = new cmDocumentationSection("Generators","GENERATORS");
    sec->Append(cmDocumentationGeneratorsHeader);
    this->AllSections["Generators"] = sec;
}